

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Holding.cpp
# Opt level: O3

bool __thiscall
Holding::ChainHoldings
          (Holding *this,list<Card_*,_std::allocator<Card_*>_> *holdings,Holding *bought)

{
  _List_node_base *p_Var1;
  _List_node_base **pp_Var2;
  undefined1 *puVar3;
  int iVar4;
  string *psVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Holding *mine;
  _List_node_base *p_Var7;
  
  psVar5 = BlackCard::getName_abi_cxx11_(&bought->super_BlackCard);
  iVar4 = std::__cxx11::string::compare((char *)psVar5);
  if (iVar4 != 0) {
    psVar5 = BlackCard::getName_abi_cxx11_(&bought->super_BlackCard);
    iVar4 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar4 != 0) {
      psVar5 = BlackCard::getName_abi_cxx11_(&bought->super_BlackCard);
      iVar4 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar4 != 0) {
        return false;
      }
    }
  }
  psVar5 = BlackCard::getName_abi_cxx11_(&bought->super_BlackCard);
  iVar4 = std::__cxx11::string::compare((char *)psVar5);
  if (iVar4 == 0) {
    for (p_Var7 = (holdings->super__List_base<Card_*,_std::allocator<Card_*>_>)._M_impl._M_node.
                  super__List_node_base._M_next; p_Var7 != (_List_node_base *)holdings;
        p_Var7 = p_Var7->_M_next) {
      psVar5 = Card::getName_abi_cxx11_((Card *)p_Var7[1]._M_next);
      iVar4 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar4 == 0) {
        p_Var1 = p_Var7 + 1;
        lVar6 = (**(code **)((long)p_Var1->_M_next + 0x48))(p_Var1);
        if (lVar6 == 0) {
          (**(code **)((long)p_Var7[1]._M_next + 0x58))(p_Var1,bought);
          (*(bought->super_BlackCard).super_Card._vptr_Card[10])(bought,p_Var1);
          lVar6 = (**(code **)((long)p_Var7[1]._M_next + 0x40))(p_Var1);
          iVar4 = *(int *)((long)&p_Var7[10]._M_next + 4);
          if (lVar6 == 0) {
            *(int *)((long)&p_Var7[10]._M_next + 4) = iVar4 + 4;
            bought->harvestValue = bought->harvestValue + 2;
            return true;
          }
          *(int *)((long)&p_Var7[10]._M_next + 4) = iVar4 * 2;
          goto LAB_0010c5b9;
        }
      }
    }
  }
  else {
    psVar5 = BlackCard::getName_abi_cxx11_(&bought->super_BlackCard);
    iVar4 = std::__cxx11::string::compare((char *)psVar5);
    if (iVar4 == 0) {
      for (p_Var7 = (holdings->super__List_base<Card_*,_std::allocator<Card_*>_>)._M_impl._M_node.
                    super__List_node_base._M_next; p_Var7 != (_List_node_base *)holdings;
          p_Var7 = (((_List_base<Card_*,_std::allocator<Card_*>_> *)&p_Var7->_M_next)->_M_impl).
                   _M_node.super__List_node_base._M_next) {
        p_Var1 = p_Var7 + 1;
        psVar5 = Card::getName_abi_cxx11_((Card *)p_Var7[1]._M_next);
        iVar4 = std::__cxx11::string::compare((char *)psVar5);
        if (iVar4 == 0) {
          lVar6 = (*(code *)((Card *)p_Var7[1]._M_next)[1].name._M_dataplus._M_p)(p_Var1);
          if (lVar6 == 0) {
            (*(code *)p_Var1->_M_next[5]._M_next)(p_Var1,bought);
            (*(bought->super_BlackCard).super_Card._vptr_Card[0xb])(bought,p_Var1);
            bought->harvestValue = bought->harvestValue + 4;
            iVar4 = 2;
            goto LAB_0010c4f9;
          }
        }
        else {
          psVar5 = Card::getName_abi_cxx11_((Card *)p_Var7[1]._M_next);
          iVar4 = std::__cxx11::string::compare((char *)psVar5);
          if ((iVar4 == 0) && (lVar6 = (*(code *)p_Var1->_M_next[4]._M_prev)(p_Var1), lVar6 == 0)) {
            (*(code *)p_Var1->_M_next[5]._M_prev)(p_Var1,bought);
            (*(bought->super_BlackCard).super_Card._vptr_Card[10])(bought,p_Var1);
            bought->harvestValue = bought->harvestValue + 5;
            iVar4 = this->harvestValue;
LAB_0010c4f9:
            pp_Var2 = (_List_node_base **)((long)&(p_Var7 + 9)[1]._M_next + 4);
            *(int *)pp_Var2 = *(int *)pp_Var2 + iVar4;
          }
        }
        iVar4 = (*(bought->super_BlackCard).super_Card._vptr_Card[9])(bought);
        if ((CONCAT44(extraout_var,iVar4) != 0) &&
           (iVar4 = (*(bought->super_BlackCard).super_Card._vptr_Card[8])(bought),
           CONCAT44(extraout_var_00,iVar4) != 0)) {
          return true;
        }
      }
      iVar4 = (*(bought->super_BlackCard).super_Card._vptr_Card[9])(bought);
      if (CONCAT44(extraout_var_01,iVar4) == 0) {
        (*(bought->super_BlackCard).super_Card._vptr_Card[8])(bought);
      }
    }
    else {
      psVar5 = BlackCard::getName_abi_cxx11_(&bought->super_BlackCard);
      iVar4 = std::__cxx11::string::compare((char *)psVar5);
      if (iVar4 == 0) {
        for (p_Var7 = (holdings->super__List_base<Card_*,_std::allocator<Card_*>_>)._M_impl._M_node.
                      super__List_node_base._M_next; p_Var7 != (_List_node_base *)holdings;
            p_Var7 = (((_List_base<Card_*,_std::allocator<Card_*>_> *)&p_Var7->_M_next)->_M_impl).
                     _M_node.super__List_node_base._M_next) {
          psVar5 = Card::getName_abi_cxx11_((Card *)p_Var7[1]._M_next);
          iVar4 = std::__cxx11::string::compare((char *)psVar5);
          if (iVar4 == 0) {
            p_Var1 = p_Var7 + 1;
            lVar6 = (*(code *)p_Var1->_M_next[4]._M_next)(p_Var1);
            if (lVar6 == 0) {
              (*(code *)p_Var1->_M_next[5]._M_next)(p_Var1,bought);
              (*(bought->super_BlackCard).super_Card._vptr_Card[0xb])(bought,p_Var1);
              lVar6 = (*(code *)p_Var1->_M_next[4]._M_prev)(p_Var1);
              if (lVar6 == 0) {
                bought->harvestValue = bought->harvestValue + 5;
                puVar3 = (undefined1 *)((long)&p_Var7[10]._M_next + 4);
                *(int *)puVar3 = *(int *)puVar3 + 3;
                return true;
              }
              puVar3 = (undefined1 *)((long)&p_Var7[10]._M_next + 4);
              *(int *)puVar3 = *(int *)puVar3 << 1;
LAB_0010c5b9:
              *(int *)((long)&p_Var7[10]._M_prev[9]._M_next + 4) =
                   *(int *)((long)&p_Var7[10]._M_prev[9]._M_next + 4) * 3;
              return true;
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool Holding::ChainHoldings(list<Card*> holdings, Holding *bought)        //creates chains and adds bonuses if there are any possible connections
{
    if (bought->getName() != "Mine" && bought->getName() != "GoldMine" && bought->getName() != "CrystalMine")
        return false;

    list<Card*>::iterator it;

    if (bought->getName() == "Mine")
    {
        for (it=holdings.begin(); it!=holdings.end(); it++)
        {
            if ((*it)->getName() != "GoldMine")
                continue;

            Holding *mine = (Holding *)(&*it);

            if (!mine->getSubHolding())
            {
                mine->setSubHolding(bought);
                bought->setUpperHolding(mine);

                if (mine->getUpperHolding())
                {
                    mine->harvestValue *= 2;
                    mine->upperHolding->harvestValue *= 3;
                }
                else
                {
                    mine->harvestValue += 4;
                    bought->harvestValue += 2;
                }
                return true;
            }
        }
    }
    else if (bought->getName() == "GoldMine")
    {
        for (it=holdings.begin(); it!=holdings.end(); it++)
        {
            if ((*it)->getName() == "Mine")
            {
                Holding *mine = (Holding *)(&*it);

                if (!mine->getUpperHolding())
                {
                    mine->setUpperHolding(bought);
                    bought->setSubHolding(mine);

                    bought->harvestValue += 4;
                    mine->harvestValue += 2;
                }
            }
            else if ((*it)->getName() == "CrystalMine")
            {
                Holding *mine = (Holding *)(&*it);

                if (!mine->getSubHolding())
                {
                    mine->setSubHolding(bought);
                    bought->setUpperHolding(mine);

                    bought->harvestValue += 5;
                    mine->harvestValue += harvestValue;
                }
            }
            
            if (bought->getSubHolding() && bought->getUpperHolding())
                return true;
        }
        if (bought->getSubHolding() || bought->getUpperHolding())
            return true;
    }
    else if (bought->getName() == "CrystalMine")
    {
        for (it=holdings.begin(); it!=holdings.end(); it++)
        {
            if ((*it)->getName() != "GoldMine")
                continue;

            Holding *mine = (Holding *)(&*it);

            if (!mine->getUpperHolding())
            {
                mine->setUpperHolding(bought);
                bought->setSubHolding(mine);

                if (mine->getSubHolding())
                {
                    mine->harvestValue *= 2;
                    mine->upperHolding->harvestValue *= 3;
                }
                else
                {
                    bought->harvestValue += 5;
                    mine->harvestValue += 3;    //3 = initial mine harvest value
                }
                break;
            }
        }
    }
    return true;
}